

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

u8 minMaxQuery(sqlite3 *db,Expr *pFunc,ExprList **ppMinMax)

{
  byte bVar1;
  byte bVar2;
  ExprList *pEVar3;
  long lVar4;
  u8 uVar5;
  u8 uVar6;
  
  pEVar3 = (pFunc->x).pList;
  if ((pEVar3 == (ExprList *)0x0) || (pEVar3->nExpr != 1)) {
    return '\0';
  }
  lVar4 = 0;
  do {
    bVar1 = (pFunc->u).zToken[lVar4];
    bVar2 = "min"[lVar4];
    if (bVar1 == bVar2) {
      if ((ulong)bVar1 == 0) goto LAB_001a62fc;
    }
    else if (""[bVar1] != ""[bVar2]) goto LAB_001a62fc;
    lVar4 = lVar4 + 1;
  } while( true );
LAB_001a6337:
  if (bVar1 != bVar2) {
    return '\0';
  }
  uVar6 = '\x01';
  uVar5 = '\x02';
  goto LAB_001a6342;
LAB_001a62fc:
  if (bVar1 != bVar2) {
    lVar4 = 0;
    do {
      bVar1 = (pFunc->u).zToken[lVar4];
      bVar2 = "max"[lVar4];
      if (bVar1 == bVar2) {
        if ((ulong)bVar1 == 0) goto LAB_001a6337;
      }
      else if (""[bVar1] != ""[bVar2]) goto LAB_001a6337;
      lVar4 = lVar4 + 1;
    } while( true );
  }
  uVar5 = '\x01';
  uVar6 = '\0';
LAB_001a6342:
  pEVar3 = sqlite3ExprListDup(db,pEVar3,0);
  *ppMinMax = pEVar3;
  if (pEVar3 != (ExprList *)0x0) {
    pEVar3->a[0].sortOrder = uVar6;
    return uVar5;
  }
  return uVar5;
}

Assistant:

static u8 minMaxQuery(sqlite3 *db, Expr *pFunc, ExprList **ppMinMax){
  int eRet = WHERE_ORDERBY_NORMAL;      /* Return value */
  ExprList *pEList = pFunc->x.pList;    /* Arguments to agg function */
  const char *zFunc;                    /* Name of aggregate function pFunc */
  ExprList *pOrderBy;
  u8 sortOrder;

  assert( *ppMinMax==0 );
  assert( pFunc->op==TK_AGG_FUNCTION );
  if( pEList==0 || pEList->nExpr!=1 ) return eRet;
  zFunc = pFunc->u.zToken;
  if( sqlite3StrICmp(zFunc, "min")==0 ){
    eRet = WHERE_ORDERBY_MIN;
    sortOrder = SQLITE_SO_ASC;
  }else if( sqlite3StrICmp(zFunc, "max")==0 ){
    eRet = WHERE_ORDERBY_MAX;
    sortOrder = SQLITE_SO_DESC;
  }else{
    return eRet;
  }
  *ppMinMax = pOrderBy = sqlite3ExprListDup(db, pEList, 0);
  assert( pOrderBy!=0 || db->mallocFailed );
  if( pOrderBy ) pOrderBy->a[0].sortOrder = sortOrder;
  return eRet;
}